

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O1

string * __thiscall
flatbuffers::java::JavaGenerator::GenTypePointer_abi_cxx11_
          (string *__return_storage_ptr__,JavaGenerator *this,Type *type)

{
  BaseType BVar1;
  char *pcVar2;
  char *pcVar3;
  undefined1 local_38 [32];
  
  BVar1 = type->base_type;
  if (BVar1 == BASE_TYPE_STRUCT) {
    IdlNamer::NamespacedType_abi_cxx11_
              ((string *)local_38,&this->namer_,&type->struct_def->super_Definition);
    std::operator+(__return_storage_ptr__,&this->package_prefix_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    if ((undefined1 *)CONCAT44(local_38._4_4_,local_38._0_4_) != local_38 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_38._4_4_,local_38._0_4_),local_38._16_8_ + 1);
    }
  }
  else if (BVar1 == BASE_TYPE_VECTOR) {
    local_38._0_4_ = type->element;
    local_38._8_8_ = type->struct_def;
    local_38._16_8_ = type->enum_def;
    local_38._24_2_ = type->fixed_length;
    local_38._4_4_ = BASE_TYPE_NONE;
    GenTypeGet_abi_cxx11_(__return_storage_ptr__,this,(Type *)local_38);
  }
  else {
    if (BVar1 == BASE_TYPE_STRING) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "String";
      pcVar2 = "";
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "Table";
      pcVar2 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypePointer(const Type &type) const {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "String";
      case BASE_TYPE_VECTOR: return GenTypeGet(type.VectorType());
      case BASE_TYPE_STRUCT:
        return Prefixed(namer_.NamespacedType(*type.struct_def));
      case BASE_TYPE_UNION: FLATBUFFERS_FALLTHROUGH();  // else fall thru
      default: return "Table";
    }
  }